

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to16.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to16_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  uint _w;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  int i;
  long lVar11;
  ulong uVar12;
  undefined4 *puVar13;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar10 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x80,inch / 8,outch / 0x10,4,(Allocator *)0x0);
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  uVar5 = (ulong)_w;
  if ((int)_w < 1) {
    uVar5 = uVar10;
  }
  for (; (long)(uVar10 | 0xf) < (long)outch; uVar10 = uVar10 + 0x10) {
    pvVar7 = (void *)((uVar10 >> 4) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar8 = 0; (long)(uVar8 | 7) < (long)inch; uVar8 = uVar8 + 8) {
      puVar4 = (undefined4 *)
               (((long)local_78.w * uVar8 + uVar10 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
        puVar9 = puVar4;
        for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
          puVar13 = puVar9;
          for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 4) {
            *(undefined4 *)((long)pvVar7 + lVar6) = *puVar13;
            puVar13 = (undefined4 *)((long)puVar13 + local_78.cstep * local_78.elemsize);
          }
          puVar9 = (undefined4 *)((long)puVar9 + local_78.elemsize * (long)local_78.w);
          pvVar7 = (void *)((long)pvVar7 + 0x40);
        }
        puVar4 = puVar4 + 1;
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-8a-maxk-inch/8a-outch/16b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 8 * maxk, inch / 8, outch / 16, (size_t)4u);

    for (int q = 0; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}